

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O3

void __thiscall
fmcalc::compute_item_proportions
          (fmcalc *this,
          vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
          *agg_vecs,vector<float,_std::allocator<float>_> *guls,uint level_,uint layer_,
          uint previous_layer_,bool allowzeros)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pfVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  undefined8 *puVar6;
  int *piVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  pointer pvVar12;
  undefined8 uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  __node_base _Var17;
  iterator __position;
  int *piVar18;
  vector<float,_std::allocator<float>_> *pvVar19;
  __node_base_ptr *pp_Var20;
  long lVar21;
  long lVar22;
  iterator iter;
  long lVar23;
  ulong uVar24;
  int *piVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  vector<int,_std::allocator<int>_> v_2;
  vector<float,_std::allocator<float>_> items_prop;
  undefined8 local_c8;
  float local_c0;
  allocator_type local_b9;
  vector<float,_std::allocator<float>_> local_b8;
  long *local_98;
  vector<float,_std::allocator<float>_> *local_90;
  undefined1 local_88 [24];
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_70;
  ulong local_38;
  
  local_90 = guls;
  if (layer_ == 1) {
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_70,
               (long)(guls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(guls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&local_b8,
               (allocator_type *)&local_c8);
    uVar26 = level_ + 1;
    if (this->allocrule_ != 3) {
      uVar26 = (int)((ulong)((long)(agg_vecs->
                                   super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(agg_vecs->
                                  super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    }
    pp_Var20 = local_70._M_buckets;
    if (1 < (int)uVar26) {
      local_38 = (ulong)uVar26;
      uVar24 = 1;
      do {
        pvVar12 = (agg_vecs->
                  super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_98 = *(long **)&pvVar12[uVar24 - 1].
                              super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                              ._M_impl.super__Vector_impl_data;
        lVar16 = local_98[3];
        if (lVar16 == local_98[4]) {
          auVar5._12_4_ = 0;
          auVar5._0_12_ = local_88._4_12_;
          local_88._0_16_ = auVar5 << 0x20;
        }
        else {
          fVar27 = 0.0;
          do {
            fVar27 = fVar27 + *(float *)(lVar16 + 8);
            lVar16 = lVar16 + 0x60;
          } while (lVar16 != local_98[4]);
          local_88._0_4_ = (int)CONCAT71((int7)((ulong)lVar16 >> 8),0.01 < fVar27);
        }
        lVar16 = *(long *)&pvVar12[uVar24].
                           super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        pfVar11 = *(float **)(lVar16 + 0x18);
        pfVar8 = *(float **)(lVar16 + 0x20);
        fVar27 = 0.0;
        pfVar9 = pfVar11;
        if (pfVar11 != pfVar8) {
          do {
            if ((0.0 < *pfVar11) || (0.0 < pfVar11[1] || allowzeros)) {
              plVar1 = *(long **)(pfVar11 + 0xe);
              fVar28 = 0.0;
              if (plVar1 != (long *)0x0) {
                local_c0 = fVar27;
                if (*(long *)(pfVar11 + 0x10) == 0) {
                  local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)((ulong)local_c8._4_4_ << 0x20);
                  std::vector<float,_std::allocator<float>_>::vector
                            (&local_b8,plVar1[1] - *plVar1 >> 2,(value_type_conflict2 *)&local_c8,
                             &local_b9);
                  puVar6 = (undefined8 *)operator_new(0x28);
                }
                else {
                  local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)((ulong)local_c8._4_4_ << 0x20);
                  std::vector<float,_std::allocator<float>_>::vector
                            (&local_b8,plVar1[1] - *plVar1 >> 2,(value_type_conflict2 *)&local_c8,
                             &local_b9);
                  puVar6 = (undefined8 *)operator_new(0x28);
                }
                puVar6[1] = 0x100000001;
                *puVar6 = &PTR___Sp_counted_ptr_inplace_00115d30;
                puVar6[2] = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start;
                puVar6[3] = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                puVar6[4] = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
                local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                *(undefined8 **)(pfVar11 + 0x10) = puVar6 + 2;
                p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pfVar11 + 0x12);
                *(undefined8 **)(pfVar11 + 0x12) = puVar6;
                if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                   (__node_base_ptr *)
                   local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start != (__node_base_ptr *)0x0)) {
                  operator_delete(local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
                }
                piVar7 = (int *)**(undefined8 **)(pfVar11 + 0xe);
                piVar25 = (int *)(*(undefined8 **)(pfVar11 + 0xe))[1];
                fVar28 = 0.0;
                fVar27 = local_c0;
                if (piVar7 != piVar25) {
                  do {
                    fVar28 = fVar28 + (guls->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_start[*piVar7];
                    piVar7 = piVar7 + 1;
                  } while (piVar7 != piVar25);
                }
              }
              pfVar11[3] = fVar28;
              fVar27 = fVar27 + *pfVar11;
              pfVar8 = *(float **)(lVar16 + 0x20);
            }
            else {
              pfVar11[3] = 0.0;
            }
            pfVar11 = pfVar11 + 0x18;
            pfVar9 = pfVar8;
          } while (pfVar11 != pfVar8);
        }
        pfVar11 = *(float **)(lVar16 + 0x18);
        if ((fVar27 <= 0.0 & local_88[0]) == 1) {
          for (; pfVar11 != pfVar9; pfVar11 = pfVar11 + 0x18) {
            puVar6 = *(undefined8 **)(pfVar11 + 0xe);
            if (puVar6 != (undefined8 *)0x0) {
              piVar7 = (int *)*puVar6;
              piVar25 = (int *)puVar6[1];
              if (piVar7 != piVar25) {
                fVar27 = pfVar11[2];
                do {
                  fVar27 = fVar27 + *(float *)((long)local_70._M_buckets + (long)*piVar7 * 4);
                  pfVar11[2] = fVar27;
                  piVar7 = piVar7 + 1;
                } while (piVar7 != piVar25);
              }
            }
          }
        }
        else if (pfVar11 != pfVar9) {
          uVar26 = -(uint)(0.0 < fVar27);
          lVar23 = 0;
          local_88._0_16_ = ZEXT416(uVar26);
          local_c0 = fVar27;
          do {
            pfVar11[2] = (float)(-(uint)(0.0 < *pfVar11) & (uint)(*pfVar11 / fVar27) & uVar26);
            puVar6 = *(undefined8 **)(pfVar11 + 0xe);
            if (uVar24 == 1) {
              if (puVar6 != (undefined8 *)0x0) {
                piVar7 = (int *)*puVar6;
                piVar25 = (int *)puVar6[1];
                if (piVar7 != piVar25) {
                  fVar28 = 0.0;
                  piVar18 = piVar7;
                  do {
                    fVar28 = fVar28 + (local_90->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_start[*piVar18];
                    piVar18 = piVar18 + 1;
                  } while (piVar18 != piVar25);
                  if ((0.0 < fVar28) && (piVar7 != piVar25)) {
                    plVar1 = *(long **)(pfVar11 + 0x10);
                    pfVar3 = (local_90->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    lVar21 = 0;
                    do {
                      lVar22 = (long)*(int *)((long)piVar7 + lVar21);
                      if (plVar1 != (long *)0x0) {
                        *(float *)(*plVar1 + lVar21) = pfVar3[lVar22] / pfVar11[3];
                      }
                      *(float *)((long)local_70._M_buckets + lVar22 * 4) =
                           (pfVar3[lVar22] / fVar28) * pfVar11[2];
                      lVar22 = lVar21 + 4;
                      lVar21 = lVar21 + 4;
                    } while ((int *)((long)piVar7 + lVar22) != piVar25);
                  }
                }
              }
            }
            else if (puVar6 != (undefined8 *)0x0) {
              piVar7 = (int *)*puVar6;
              piVar25 = (int *)puVar6[1];
              if (piVar7 != piVar25) {
                fVar28 = 0.0;
                piVar18 = piVar7;
                do {
                  fVar28 = fVar28 + *(float *)((long)local_70._M_buckets + (long)*piVar18 * 4);
                  piVar18 = piVar18 + 1;
                } while (piVar18 != piVar25);
                if (0.0 < fVar28) {
                  if (piVar7 != piVar25) {
                    plVar1 = *(long **)(pfVar11 + 0x10);
                    lVar21 = 0;
                    do {
                      lVar22 = (long)*(int *)((long)piVar7 + lVar21);
                      if (plVar1 != (long *)0x0) {
                        *(float *)(*plVar1 + lVar21) =
                             *(float *)((long)local_70._M_buckets + lVar22 * 4) / fVar28;
                      }
                      *(float *)((long)local_70._M_buckets + lVar22 * 4) =
                           (*(float *)((long)local_70._M_buckets + lVar22 * 4) / fVar28) *
                           pfVar11[2];
                      lVar22 = lVar21 + 4;
                      lVar21 = lVar21 + 4;
                    } while ((int *)((long)piVar7 + lVar22) != piVar25);
                  }
                  goto LAB_00103009;
                }
              }
              lVar21 = local_98[3] + lVar23 * 0x60;
              *(undefined8 *)(pfVar11 + 0x10) = *(undefined8 *)(lVar21 + 0x40);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pfVar11 + 0x12),
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar21 + 0x48));
              pfVar9 = *(float **)(lVar16 + 0x20);
              fVar27 = local_c0;
              uVar26 = local_88._0_4_;
            }
LAB_00103009:
            pfVar11 = pfVar11 + 0x18;
            lVar23 = lVar23 + 1;
          } while (pfVar11 != pfVar9);
        }
        uVar24 = uVar24 + 1;
        pp_Var20 = local_70._M_buckets;
        guls = local_90;
      } while (uVar24 != local_38);
    }
  }
  else {
    if (previous_layer_ < layer_) {
      lVar16 = *(long *)&(agg_vecs->
                         super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[level_].
                         super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      uVar10 = (ulong)layer_;
      lVar23 = *(long *)(lVar16 + 0x20) - *(long *)(lVar16 + 0x18) >> 5;
      uVar14 = lVar23 * -0x5555555555555555;
      uVar24 = (*(long *)(lVar16 + 8 + uVar10 * 0x18) - *(long *)(lVar16 + uVar10 * 0x18) >> 5) *
               -0x5555555555555555;
      if (uVar24 < uVar14 || uVar24 + lVar23 * 0x5555555555555555 == 0) {
        uVar24 = uVar14;
      }
      if (uVar24 == 0) {
        return;
      }
      lVar23 = 0x48;
      do {
        lVar21 = *(long *)(lVar16 + 0x18);
        lVar22 = *(long *)(lVar16 + uVar10 * 0x18);
        *(undefined4 *)(lVar22 + -0x40 + lVar23) = *(undefined4 *)(lVar21 + -0x40 + lVar23);
        *(undefined8 *)(lVar22 + -8 + lVar23) = *(undefined8 *)(lVar21 + -8 + lVar23);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar22 + lVar23),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar21 + lVar23));
        lVar23 = lVar23 + 0x60;
        uVar24 = uVar24 - 1;
      } while (uVar24 != 0);
      return;
    }
    lVar16 = *(long *)&(agg_vecs->
                       super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[level_ - 1].
                       super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                       ._M_impl.super__Vector_impl_data;
    local_98 = (long *)(lVar16 + (ulong)previous_layer_ * 0x18);
    lVar23 = *local_98;
    lVar21 = local_98[1];
    if (lVar21 != lVar23) {
      lVar22 = 0x48;
      uVar24 = 0;
      do {
        if (*(long *)(lVar23 + -8 + lVar22) == 0) {
          lVar21 = *(long *)(lVar16 + 0x18);
          *(undefined8 *)(lVar23 + -8 + lVar22) = *(undefined8 *)(lVar21 + -8 + lVar22);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar23 + lVar22),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar21 + lVar22));
          lVar23 = *local_98;
          lVar21 = local_98[1];
        }
        uVar24 = uVar24 + 1;
        lVar22 = lVar22 + 0x60;
      } while (uVar24 < (ulong)((lVar21 - lVar23 >> 5) * -0x5555555555555555));
    }
    local_70._M_buckets = (__buckets_ptr)CONCAT44(local_70._M_buckets._4_4_,0xffffffff);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_b8,
               (long)(local_90->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(local_90->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&local_70,
               (allocator_type *)&local_c8);
    lVar16 = *local_98;
    lVar23 = local_98[1];
    if (lVar16 != lVar23) {
      iVar15 = 0;
      do {
        puVar6 = *(undefined8 **)(lVar16 + 0x38);
        if (puVar6 != (undefined8 *)0x0) {
          piVar25 = (int *)puVar6[1];
          for (piVar7 = (int *)*puVar6; piVar7 != piVar25; piVar7 = piVar7 + 1) {
            *(int *)((long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + (long)*piVar7 * 4) = iVar15;
          }
        }
        iVar15 = iVar15 + 1;
        lVar16 = lVar16 + 0x60;
      } while (lVar16 != lVar23);
    }
    uVar24 = (ulong)layer_;
    pvVar12 = (agg_vecs->
              super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar16 = *(long *)&pvVar12[level_].
                       super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                       ._M_impl.super__Vector_impl_data;
    lVar23 = *(long *)(lVar16 + uVar24 * 0x18);
    pp_Var20 = (__node_base_ptr *)
               local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (*(long *)(lVar16 + 8 + uVar24 * 0x18) != lVar23) {
      pvVar19 = (vector<float,_std::allocator<float>_> *)0x0;
      do {
        lVar16 = (long)pvVar19 * 0x60;
        puVar6 = *(undefined8 **)(lVar23 + 0x38 + lVar16);
        if (puVar6 != (undefined8 *)0x0) {
          piVar7 = (int *)*puVar6;
          local_70._M_buckets = &local_70._M_single_bucket;
          local_70._M_bucket_count = 1;
          local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_70._M_element_count = 0;
          local_70._M_rehash_policy._M_max_load_factor = 1.0;
          local_70._M_rehash_policy._M_next_resize = 0;
          local_70._M_single_bucket = (__node_base_ptr)0x0;
          lVar23 = *(long *)(*(long *)&pvVar12[level_].
                                       super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                       ._M_impl.super__Vector_impl_data + uVar24 * 0x18);
          puVar6 = *(undefined8 **)(lVar23 + 0x38 + lVar16);
          local_c0 = 0.0;
          local_90 = pvVar19;
          if (piVar7 != (int *)puVar6[1]) {
            do {
              local_c8 = &local_70;
              std::
              _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                        ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&local_70,
                         (long)*piVar7 * 4 +
                         (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start,&local_c8);
              piVar7 = piVar7 + 1;
              lVar23 = *(long *)(*(long *)&(agg_vecs->
                                           super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start[level_].
                                           super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar24 * 0x18);
              puVar6 = *(undefined8 **)(lVar23 + 0x38 + lVar16);
            } while (piVar7 != (int *)puVar6[1]);
            if (local_70._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
              local_c0 = 0.0;
              _Var17._M_nxt = local_70._M_before_begin._M_nxt;
              do {
                local_c0 = local_c0 +
                           *(float *)(*local_98 + (long)*(int *)&_Var17._M_nxt[1]._M_nxt * 0x60);
                _Var17._M_nxt = (_Var17._M_nxt)->_M_nxt;
              } while (_Var17._M_nxt != (_Hash_node_base *)0x0);
            }
          }
          plVar1 = local_98;
          piVar25 = (int *)*puVar6;
          if (piVar25 != piVar7) {
            do {
              if (*(long *)(lVar23 + 0x40 + lVar16) == 0) {
                puVar6 = (undefined8 *)operator_new(0x28);
                puVar6[1] = 0x100000001;
                *puVar6 = &PTR___Sp_counted_ptr_inplace_00115d30;
                puVar6[2] = 0;
                puVar6[3] = 0;
                puVar6[4] = 0;
                lVar23 = *(long *)(*(long *)&(agg_vecs->
                                             super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[level_].
                                             super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar24 * 0x18);
                *(undefined8 **)(lVar23 + 0x40 + lVar16) = puVar6 + 2;
                p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar23 + 0x48 + lVar16);
                *(undefined8 **)(lVar23 + 0x48 + lVar16) = puVar6;
                if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
                }
              }
              if (local_c0 <= 0.0) {
                pvVar19 = *(vector<float,_std::allocator<float>_> **)
                           (*(long *)(*(long *)&(agg_vecs->
                                                super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start[level_].
                                                super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                                ._M_impl.super__Vector_impl_data + uVar24 * 0x18) +
                            0x40 + lVar16);
                local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)((ulong)local_c8._4_4_ << 0x20);
                __position._M_current =
                     (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current !=
                    (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_00103456;
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (pvVar19,__position,(float *)&local_c8);
              }
              else {
                lVar21 = (long)*(int *)((long)local_b8.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                       (long)*piVar25 * 4) * 0x60;
                plVar4 = *(long **)(*plVar1 + 0x38 + lVar21);
                lVar23 = *plVar4;
                lVar22 = plVar4[1] - lVar23;
                if (lVar22 != 0) {
                  pfVar11 = (float *)(*plVar1 + lVar21);
                  lVar22 = lVar22 >> 2;
                  lVar21 = 0;
                  do {
                    if (*(int *)(lVar23 + lVar21 * 4) == *piVar25) {
                      if (-1 < (int)(uint)lVar21) {
                        fVar27 = *pfVar11;
                        pvVar19 = *(vector<float,_std::allocator<float>_> **)
                                   (*(long *)(*(long *)&(agg_vecs->
                                                                                                                
                                                  super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[level_]
                                                  .
                                                  super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar24 * 0x18)
                                    + 0x40 + lVar16);
                        if (fVar27 <= 0.0) {
                          local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                      *)((ulong)local_c8._4_4_ << 0x20);
                          __position._M_current =
                               (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (__position._M_current !=
                              (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_end_of_storage) goto LAB_00103456;
                          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                                    (pvVar19,__position,(float *)&local_c8);
                          goto LAB_0010346e;
                        }
                        plVar4 = *(long **)(pfVar11 + 0x10);
                        uVar10 = (ulong)((uint)lVar21 & 0x7fffffff);
                        lVar23 = *plVar4;
                        if ((ulong)(plVar4[1] - lVar23 >> 2) <= uVar10) {
                          uVar13 = std::__throw_out_of_range_fmt
                                             (
                                             "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                             );
                          _Unwind_Resume(uVar13);
                        }
                        fVar27 = (fVar27 * *(float *)(lVar23 + uVar10 * 4)) / local_c0;
                        local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                    *)CONCAT44(local_c8._4_4_,fVar27);
                        __position._M_current =
                             (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                        if (__position._M_current !=
                            (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          *__position._M_current = fVar27;
                          goto LAB_0010345c;
                        }
                        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                                  (pvVar19,__position,(float *)&local_c8);
                        goto LAB_0010346e;
                      }
                      break;
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar22 + (ulong)(lVar22 == 0) != lVar21);
                }
                pvVar19 = *(vector<float,_std::allocator<float>_> **)
                           (*(long *)(*(long *)&(agg_vecs->
                                                super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start[level_].
                                                super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                                ._M_impl.super__Vector_impl_data + uVar24 * 0x18) +
                            0x40 + lVar16);
                local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)((ulong)local_c8._4_4_ << 0x20);
                __position._M_current =
                     (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (pvVar19,__position,(float *)&local_c8);
                }
                else {
LAB_00103456:
                  *__position._M_current = 0.0;
LAB_0010345c:
                  (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
              }
LAB_0010346e:
              piVar25 = piVar25 + 1;
              lVar23 = *(long *)(*(long *)&(agg_vecs->
                                           super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start[level_].
                                           super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar24 * 0x18);
            } while (piVar25 != *(int **)(*(long *)(lVar23 + 0x38 + lVar16) + 8));
          }
          std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_70);
          pvVar12 = (agg_vecs->
                    super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar19 = local_90;
        }
        pvVar19 = (vector<float,_std::allocator<float>_> *)
                  ((long)&(pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + 1);
        lVar16 = *(long *)&pvVar12[level_].
                           super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        lVar23 = *(long *)(lVar16 + uVar24 * 0x18);
        pp_Var20 = (__node_base_ptr *)
                   local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (pvVar19 < (vector<float,_std::allocator<float>_> *)
                         ((*(long *)(lVar16 + 8 + uVar24 * 0x18) - lVar23 >> 5) *
                         -0x5555555555555555));
    }
  }
  if (pp_Var20 != (__node_base_ptr *)0x0) {
    operator_delete(pp_Var20);
  }
  return;
}

Assistant:

void fmcalc::compute_item_proportions(std::vector<std::vector<std::vector <LossRec>>> &agg_vecs, const std::vector<OASIS_FLOAT> &guls, unsigned int level_, unsigned int layer_,unsigned int previous_layer_,bool allowzeros)
{

	if (layer_ == 1) {
		std::vector<OASIS_FLOAT> items_prop (guls.size(), 0);
		int from_level = 1;
		int to_level = agg_vecs.size();
		if (allocrule_ == 3) {
			from_level = level_;
			to_level = from_level + 1;
		}
		for (int level = 1; level < to_level; level++) {
			vector <LossRec> &agg_vec = agg_vecs[level][layer_];
			vector <LossRec>& previous_agg_vec = agg_vecs[level-1][layer_];
			OASIS_FLOAT loss_total = 0;
			OASIS_FLOAT retained_loss_total = 0;
			OASIS_FLOAT previous_proportions_total = 0;
			auto p_iter = previous_agg_vec.begin();
			while (p_iter != previous_agg_vec.end()) {
				previous_proportions_total += p_iter->proportion;
				p_iter++;
			}
			auto iter = agg_vec.begin();
 			while (iter != agg_vec.end()) {
				if (iter->loss > 0 || iter->retained_loss > 0 || allowzeros == true) {
					OASIS_FLOAT total = 0;
					if (iter->item_idx) {
						if (iter->item_prop == nullptr) {
							iter->item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>((iter->item_idx)->size(), 0));
						}
						else {
							//(iter->item_prop)->resize((iter->item_idx)->size(), 0);
							iter->item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>((iter->item_idx)->size(), 0));
						}
						for (int idx : *(iter->item_idx)) {	// if this is the first level there should only be one item_idx
							total += guls[idx];
						}
					}
					iter->gul_total = total;
					loss_total += iter->loss;
					retained_loss_total += iter->retained_loss;
				}
				else {
					iter->gul_total = 0;
					retained_loss_total += iter->retained_loss;
				}
				iter++;
			}
			if (loss_total <= 0 && previous_proportions_total > 0.01) {
				// check level and layer_
				// if there is no loss_total loss just copy previous level proportions
				auto iter = agg_vec.begin();		// loop through again to work out proportion
				//auto previous_iter = previous_agg_vec.begin();		// loop through again to work out proportion
				while (iter != agg_vec.end()) {
					if (iter->item_idx) {
						for (int idx : *(iter->item_idx)) {
							//std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
							iter->proportion = iter->proportion + items_prop[idx];
						}
					}
					iter++;
				}
			}
			else {
				iter = agg_vec.begin();		// loop thru again to work out proportion
				int agg_vec_idx = 0;
				while (iter != agg_vec.end()) {
					if (iter->loss > 0 && loss_total > 0) {
						iter->proportion = iter->loss / loss_total;
					}
					else {
						iter->proportion = 0;
					}
					if (level == 1) {
						OASIS_FLOAT total = 0;
						if (iter->item_idx) {
							for (int idx : *(iter->item_idx)) {
								total += guls[idx];
							}
						}
						int i = 0;
						if (total > 0) {
							for (int idx : *(iter->item_idx)) {
								if (iter->item_prop != nullptr) {
									std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
									v[i] = guls[idx] / iter->gul_total;
								}
								items_prop[idx] = (guls[idx] / total) * iter->proportion;
								i++;
							}
						}
					}
					else {
						OASIS_FLOAT prop_total = 0;
						if (iter->item_idx) {
							for (int idx : *(iter->item_idx)) {
								prop_total += items_prop[idx];
							}
						}
						int i = 0;
						if (prop_total > 0) {
							if (iter->item_idx) {
								for (int idx : *(iter->item_idx)) {
									if (iter->item_prop != nullptr) {
										std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
										v[i] = items_prop[idx] / prop_total;
									}
									items_prop[idx] = (items_prop[idx] / prop_total) * iter->proportion;									
									i++;
								}
							}
						}
						else {
							if (iter->item_idx) {
								iter->item_prop = previous_agg_vec[agg_vec_idx].item_prop;
								//iter->limit_surplus = 5678;
							}
						}
					}
					iter++;
					agg_vec_idx++;
				}
			}			
		}
	}
	else {
		if (previous_layer_ < layer_) {
			vector <LossRec> &prev_agg_vec = agg_vecs[level_][1];
			vector <LossRec> &current_agg_vec = agg_vecs[level_][layer_];
			size_t iMax =  prev_agg_vec.size();
			if (current_agg_vec.size() > iMax) iMax = current_agg_vec.size();
			for (size_t i = 0; i < iMax; i++) {
				current_agg_vec[i].proportion = prev_agg_vec[i].proportion;
				current_agg_vec[i].item_prop = prev_agg_vec[i].item_prop;
			}			
		}
		else {			
			vector <LossRec> &prev_agg_vec = agg_vecs[level_ - 1][previous_layer_];
			vector <LossRec> &prev_agg_vec_base = agg_vecs[level_ - 1][1];
			for (size_t i = 0; i < prev_agg_vec.size(); i++) {
				//if (prev_agg_vec[i].item_prop->size() == 0) {
				if (prev_agg_vec[i].item_prop == nullptr) {
					//prev_agg_vec[i].loss = prev_agg_vec_base[i].loss;
					prev_agg_vec[i].item_prop = prev_agg_vec_base[i].item_prop;
				}
			}
			//

			std::vector<int> v(guls.size(), -1);
			//v.resize(guls.size(), -1);
			auto iter = prev_agg_vec.begin();
			int j = 0;

			while (iter != prev_agg_vec.end()) {
				if (iter->item_idx) {
					auto it = iter->item_idx->begin();
					while (it != iter->item_idx->end()) {
						v[*it] = j;
						it++;
					}
				}
				j++;
				iter++;
			}
			for (size_t y = 0; y < agg_vecs[level_][layer_].size(); y++) {
				if (agg_vecs[level_][layer_][y].item_idx != nullptr) {
					auto it = agg_vecs[level_][layer_][y].item_idx->begin();
					// 1 create an item id  to prev_agg_vec index
					// 2 use below loop to create a set which will then be used to iterate and get previous_gul_total
					std::unordered_set<int> s;
					while (it != agg_vecs[level_][layer_][y].item_idx->end()) {
						s.insert(v[*it]);
						//prev_gul_total += prev_agg_vec[*it].loss;
						it++;
					}

					OASIS_FLOAT prev_gul_total = 0;
					auto s_iter = s.begin();
					while (s_iter != s.end()) {
						prev_gul_total += prev_agg_vec[*s_iter].loss;
						s_iter++;
					}

					// agg_vecs[level_][layer_][y].loss = prev_gul_total;
					it = agg_vecs[level_][layer_][y].item_idx->begin();
					while (it != agg_vecs[level_][layer_][y].item_idx->end()) {
						if (agg_vecs[level_][layer_][y].item_prop == nullptr) {
							agg_vecs[level_][layer_][y].item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>());
						}
						if (prev_gul_total > 0) {
							int j = -1;
							const std::vector<int>& z = *(prev_agg_vec[v[*it]].item_idx);
							for (size_t i = 0; i < z.size(); i++) {
								if (z[i] == *it) {
									j = i;
									break;
								}
							}
							// this is recomputing the first layers proportions
							if (j > -1) {
								if (prev_agg_vec[v[*it]].loss > 0 ) agg_vecs[level_][layer_][y].item_prop->push_back(prev_agg_vec[v[*it]].loss * prev_agg_vec[v[*it]].item_prop->at(j) / prev_gul_total);
								else agg_vecs[level_][layer_][y].item_prop->push_back(0);
							}
							else {
								agg_vecs[level_][layer_][y].item_prop->push_back(0);
							}

						}
						else {
							agg_vecs[level_][layer_][y].item_prop->push_back(0);
						}
						it++;
					}
				}
			}
		}		
		return;

	}
}